

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::TreeMap<kj::String,_int>::Entry>::removeLast
          (ArrayBuilder<kj::TreeMap<kj::String,_int>::Entry> *this)

{
  long lVar1;
  ArrayBuilder<kj::StringPtr> *this_local;
  
  if (*(ulong *)this < *(ulong *)(this + 8)) {
    lVar1 = *(long *)(this + 8);
    *(StringPtr **)(this + 8) = (StringPtr *)(lVar1 + -0x20);
    dtor<kj::TreeMap<kj::String,int>::Entry>((StringPtr *)(lVar1 + -0x20));
    return;
  }
  kj::_::inlineRequireFailure
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array.h"
             ,0x1b3,"pos > ptr","\"No elements present to remove.\"",
             "No elements present to remove.");
}

Assistant:

void removeLast() {
    KJ_IREQUIRE(pos > ptr, "No elements present to remove.");
    kj::dtor(*--pos);
  }